

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_issuer_source_sync_unittest.h
# Opt level: O2

bool __thiscall
bssl::CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>::
IssuersMatch(CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
             *this,shared_ptr<const_bssl::ParsedCertificate> *cert,
            ParsedCertificateList *expected_matches)

{
  element_type *peVar1;
  bool bVar2;
  char *message;
  shared_ptr<const_bssl::ParsedCertificate> *it;
  pointer psVar3;
  shared_ptr<const_bssl::ParsedCertificate> *it_1;
  pointer psVar4;
  AssertHelper AStack_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  AssertionResult gtest_ar;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> der_expected_matches;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> der_result_matches;
  ParsedCertificateList matches;
  
  matches.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matches.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matches.
  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*(this->delegate_).source_.super_CertIssuerSource._vptr_CertIssuerSource[2])
            (&this->delegate_,
             (cert->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  psVar4 = matches.
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  der_result_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  der_result_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  der_result_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  for (psVar3 = matches.
                super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar4; psVar3 = psVar3 + 1) {
    peVar1 = (psVar3->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    der_expected_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)(peVar1->cert_).data_.data_;
    der_expected_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)(peVar1->cert_).data_.size_;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::
    emplace_back<bssl::der::Input>(&der_result_matches,(Input *)&der_expected_matches);
  }
  ::std::
  __sort<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (der_result_matches.
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_start,
             der_result_matches.
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_finish);
  der_expected_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  der_expected_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  der_expected_matches.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar3 = (expected_matches->
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (expected_matches->
                super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar3; psVar4 = psVar4 + 1) {
    peVar1 = (psVar4->super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    gtest_ar._0_8_ = (peVar1->cert_).data_.data_;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(peVar1->cert_).data_.size_;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::
    emplace_back<bssl::der::Input>(&der_expected_matches,(Input *)&gtest_ar);
  }
  ::std::
  __sort<__gnu_cxx::__normal_iterator<bssl::der::Input*,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (der_expected_matches.
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_start,
             der_expected_matches.
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_finish);
  bVar2 = ::std::operator==(&der_expected_matches,&der_result_matches);
  if (!bVar2) {
    testing::internal::
    CmpHelperEQ<std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>,std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>>
              ((internal *)&gtest_ar,"der_expected_matches","der_result_matches",
               &der_expected_matches,&der_result_matches);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_a0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/cert_issuer_source_sync_unittest.h"
                 ,0x7d,message);
      testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
      }
    }
    ::std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
            (&der_expected_matches.
              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>);
  ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
            (&der_result_matches.
              super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>);
  ::std::
  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
  ::~vector(&matches);
  return bVar2;
}

Assistant:

bool IssuersMatch(std::shared_ptr<const ParsedCertificate> cert,
                    ParsedCertificateList expected_matches) {
    ParsedCertificateList matches;
    source().SyncGetIssuersOf(cert.get(), &matches);

    std::vector<der::Input> der_result_matches;
    for (const auto &it : matches) {
      der_result_matches.push_back(it->der_cert());
    }
    std::sort(der_result_matches.begin(), der_result_matches.end());

    std::vector<der::Input> der_expected_matches;
    for (const auto &it : expected_matches) {
      der_expected_matches.push_back(it->der_cert());
    }
    std::sort(der_expected_matches.begin(), der_expected_matches.end());

    if (der_expected_matches == der_result_matches) {
      return true;
    }

    // Print some extra information for debugging.
    EXPECT_EQ(der_expected_matches, der_result_matches);
    return false;
  }